

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reductors.cpp
# Opt level: O0

void opengv::absolute_pose::modules::gpnp5::groebnerRow39_10010_f
               (Matrix<double,_44,_80,_0,_44,_80> *groebnerMatrix,int targetRow)

{
  Scalar SVar1;
  Scalar *pSVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double factor;
  Index in_stack_ffffffffffffff98;
  DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1> *in_stack_ffffffffffffffa0;
  DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1> *this;
  
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0x9cf681);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1> *)*pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff98,0x9cf69f);
  dVar3 = (double)this / *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff98,0x9cf6c3);
  *pSVar2 = 0.0;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff98,0x9cf6eb);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff98,0x9cf709);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = SVar1;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *pSVar2;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar4,auVar8,auVar12);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff98,0x9cf759);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff98,0x9cf777);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = SVar1;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *pSVar2;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar5,auVar9,auVar13);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff98,0x9cf7c7);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff98,0x9cf7e5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = SVar1;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *pSVar2;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar6,auVar10,auVar14);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff98,0x9cf835);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff98,0x9cf853);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = SVar1;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *pSVar2;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar7,auVar11,auVar15);
  *pSVar2 = auVar4._0_8_;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp5::groebnerRow39_10010_f( Eigen::Matrix<double,44,80> & groebnerMatrix, int targetRow )
{
  double factor = groebnerMatrix(targetRow,46) / groebnerMatrix(39,75);
  groebnerMatrix(targetRow,46) = 0.0;
  groebnerMatrix(targetRow,48) -= factor * groebnerMatrix(39,76);
  groebnerMatrix(targetRow,51) -= factor * groebnerMatrix(39,77);
  groebnerMatrix(targetRow,55) -= factor * groebnerMatrix(39,78);
  groebnerMatrix(targetRow,70) -= factor * groebnerMatrix(39,79);
}